

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

Material * __thiscall tinyusdz::Prim::as<tinyusdz::Material>(Prim *this)

{
  Material *pMVar1;
  Prim *this_local;
  
  pMVar1 = tinyusdz::value::Value::as<tinyusdz::Material>(&this->_data,false);
  return pMVar1;
}

Assistant:

const T *as() const {
    // Check if T is Prim type. e.g. Xform, Material, ...
    if ((value::TypeId::TYPE_ID_MODEL_BEGIN <=
         value::TypeTraits<T>::type_id()) &&
        (value::TypeId::TYPE_ID_MODEL_END > value::TypeTraits<T>::type_id())) {
      return _data.as<T>();
    }

    return nullptr;
  }